

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

double __thiscall NJamSpell::TLangModel::Score(TLangModel *this,wstring *str)

{
  value_type *pvVar1;
  double dVar2;
  vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *s;
  undefined1 auVar3 [8];
  TWord *w;
  value_type *__x;
  undefined1 local_70 [8];
  TSentences sentences;
  TWords words;
  
  TTokenizer::Process((TSentences *)local_70,&this->Tokenizer,str);
  sentences.
  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (auVar3 = local_70;
      auVar3 != (undefined1  [8])
                sentences.
                super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar3 = (undefined1  [8])((long)auVar3 + 0x18)) {
    pvVar1 = (((pointer)auVar3)->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (((pointer)auVar3)->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 &sentences.
                  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    }
  }
  dVar2 = Score(this,(TWords *)
                     &sentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
            ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
             &sentences.
              super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_70);
  return dVar2;
}

Assistant:

double TLangModel::Score(const std::wstring& str) const {
    TSentences sentences = Tokenizer.Process(str);
    TWords words;
    for (auto&& s: sentences) {
        for (auto&& w: s) {
            words.push_back(w);
        }
    }
    return Score(words);
}